

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O1

void nes_w_nsfplay(void *chip,UINT8 offset,UINT8 data)

{
  if (offset < 0x20) {
    NES_APU_np_Write(*(void **)((long)chip + 8),offset | 0x4000,data);
    NES_DMC_np_Write(*(void **)((long)chip + 0x10),offset | 0x4000,data);
    return;
  }
  if ((*(void **)((long)chip + 0x18) != (void *)0x0) && (*(char *)((long)chip + 0x28) == '\0')) {
    NES_FDS_Write(*(void **)((long)chip + 0x18),offset | 0x4000,data);
    return;
  }
  return;
}

Assistant:

static void nes_w_nsfplay(void* chip, UINT8 offset, UINT8 data)
{
	NESAPU_INF* info = (NESAPU_INF*)chip;
	
	if (offset < 0x20)	// NES APU
	{
		// NES_APU handles the sqaure waves, NES_DMC the rest
		NES_APU_np_Write(info->chip_apu, 0x4000 | offset, data);
		NES_DMC_np_Write(info->chip_dmc, 0x4000 | offset, data);
	}
	else	// FDS
	{
#ifdef EC_NES_NSFP_FDS
		if (info->chip_fds != NULL && ! info->fds_disable)
			NES_FDS_Write(info->chip_fds, 0x4000 | offset, data);
#endif
	}
	return;
}